

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodInvocation.cpp
# Opt level: O2

void __thiscall
MethodInvocation::MethodInvocation
          (MethodInvocation *this,string *call_from,string *method_name,
          MethodExpression *arguments_list)

{
  (this->super_Expression).super_Node._vptr_Node = (_func_int **)&PTR_Accept_00160980;
  (this->super_Statement).super_Node._vptr_Node = (_func_int **)&PTR_Accept_001609a8;
  std::__cxx11::string::string((string *)&this->call_from_,(string *)call_from);
  std::__cxx11::string::string((string *)&this->method_name_,(string *)method_name);
  this->arguments_list_ = arguments_list;
  return;
}

Assistant:

MethodInvocation::MethodInvocation(std::string call_from,
                                   std::string method_name,
                                   MethodExpression* arguments_list)
    : call_from_(std::move(call_from)),
      method_name_(std::move(method_name)),
      arguments_list_(arguments_list) {}